

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_parameter_expression.cpp
# Opt level: O1

void duckdb::BoundParameterExpression::Invalidate(Expression *expr)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  size_type sVar2;
  undefined8 uVar3;
  BoundParameterExpression *pBVar4;
  BoundParameterData *pBVar5;
  InternalException *this;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  string local_58;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  if ((expr->super_BaseExpression).type == VALUE_PARAMETER) {
    pBVar4 = BaseExpression::Cast<duckdb::BoundParameterExpression>(&expr->super_BaseExpression);
    LogicalType::LogicalType((LogicalType *)&local_58,SQLNULL);
    uVar3 = local_58.field_2._M_allocated_capacity;
    sVar2 = local_58._M_string_length;
    (pBVar4->super_Expression).return_type.id_ = (LogicalTypeId)local_58._M_dataplus._M_p;
    (pBVar4->super_Expression).return_type.physical_type_ = local_58._M_dataplus._M_p._1_1_;
    uVar6 = *(undefined4 *)
             &(pBVar4->super_Expression).return_type.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar7 = *(undefined4 *)
             ((long)&(pBVar4->super_Expression).return_type.type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
             4);
    uVar8 = *(undefined4 *)
             &(pBVar4->super_Expression).return_type.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    uVar9 = *(undefined4 *)
             ((long)&(pBVar4->super_Expression).return_type.type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 4);
    (pBVar4->super_Expression).return_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pBVar4->super_Expression).return_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_58._M_string_length = 0;
    local_58.field_2._M_allocated_capacity = 0;
    p_Var1 = (pBVar4->super_Expression).return_type.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    (pBVar4->super_Expression).return_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)sVar2;
    (pBVar4->super_Expression).return_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_38 = uVar6;
      uStack_34 = uVar7;
      uStack_30 = uVar8;
      uStack_2c = uVar9;
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      uVar6 = local_38;
      uVar7 = uStack_34;
      uVar8 = uStack_30;
      uVar9 = uStack_2c;
    }
    uVar3 = local_58.field_2._M_allocated_capacity;
    local_58._M_string_length = CONCAT44(uVar7,uVar6);
    local_58.field_2._M_allocated_capacity._4_4_ = uVar9;
    local_58.field_2._M_allocated_capacity._0_4_ = uVar8;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3);
    }
    LogicalType::~LogicalType((LogicalType *)&local_58);
    LogicalType::LogicalType((LogicalType *)&local_58,INVALID);
    pBVar5 = shared_ptr<duckdb::BoundParameterData,_true>::operator->(&pBVar4->parameter_data);
    uVar3 = local_58.field_2._M_allocated_capacity;
    sVar2 = local_58._M_string_length;
    (pBVar5->return_type).id_ = (LogicalTypeId)local_58._M_dataplus._M_p;
    (pBVar5->return_type).physical_type_ = local_58._M_dataplus._M_p._1_1_;
    uVar6 = *(undefined4 *)
             &(pBVar5->return_type).type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar7 = *(undefined4 *)
             ((long)&(pBVar5->return_type).type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
             4);
    uVar8 = *(undefined4 *)
             &(pBVar5->return_type).type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    uVar9 = *(undefined4 *)
             ((long)&(pBVar5->return_type).type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 4);
    (pBVar5->return_type).type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pBVar5->return_type).type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_58._M_string_length = 0;
    local_58.field_2._M_allocated_capacity = 0;
    p_Var1 = (pBVar5->return_type).type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    (pBVar5->return_type).type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)sVar2;
    (pBVar5->return_type).type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_38 = uVar6;
      uStack_34 = uVar7;
      uStack_30 = uVar8;
      uStack_2c = uVar9;
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      uVar6 = local_38;
      uVar7 = uStack_34;
      uVar8 = uStack_30;
      uVar9 = uStack_2c;
    }
    uVar3 = local_58.field_2._M_allocated_capacity;
    local_58._M_string_length = CONCAT44(uVar7,uVar6);
    local_58.field_2._M_allocated_capacity._4_4_ = uVar9;
    local_58.field_2._M_allocated_capacity._0_4_ = uVar8;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3);
    }
    LogicalType::~LogicalType((LogicalType *)&local_58);
    return;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,
             "BoundParameterExpression::Invalidate requires a parameter as input","");
  InternalException::InternalException(this,&local_58);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BoundParameterExpression::Invalidate(Expression &expr) {
	if (expr.GetExpressionType() != ExpressionType::VALUE_PARAMETER) {
		throw InternalException("BoundParameterExpression::Invalidate requires a parameter as input");
	}
	auto &bound_parameter = expr.Cast<BoundParameterExpression>();
	bound_parameter.return_type = LogicalTypeId::SQLNULL;
	bound_parameter.parameter_data->return_type = LogicalTypeId::INVALID;
}